

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerQueue.h
# Opt level: O3

void __thiscall
WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
::WorkerQueue(WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
              *this,int numWorkers,
             WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             *args,Database<DNA> *args_1,SearchParams<DNA> *args_2)

{
  id *piVar1;
  WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *local_70;
  WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *args_local;
  Database<DNA> *args_local_1;
  SearchParams<DNA> *local_58;
  condition_variable *local_50;
  WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
  *local_48;
  WorkerQueue<QueryDatabaseSearcherWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_const_Database<DNA>_*,_const_SearchParams<DNA>_&>
  *local_40;
  thread local_38;
  
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_70 = args;
  args_local = (WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)args_1;
  local_58 = args_2;
  std::_Deque_base<std::thread,_std::allocator<std::thread>_>::_M_initialize_map
            ((_Deque_base<std::thread,_std::allocator<std::thread>_> *)this,0);
  std::condition_variable::condition_variable((condition_variable *)(this + 0x50));
  *(undefined8 *)(this + 0x99) = 0;
  *(undefined8 *)(this + 0xa1) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined8 *)(this + 0x98) = 0;
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0xac) = 0;
  *(undefined8 *)(this + 0xb4) = 0;
  *(undefined8 *)(this + 0xbc) = 0;
  *(undefined8 *)(this + 0xc4) = 0;
  *(undefined8 *)(this + 0xcc) = 0;
  *(undefined8 *)(this + 0xd4) = 0;
  *(undefined8 *)(this + 0xdc) = 0;
  *(undefined8 *)(this + 0xe4) = 0;
  *(undefined8 *)(this + 0xec) = 0;
  *(undefined8 *)(this + 0xf4) = 0;
  *(undefined4 *)(this + 0xfc) = 0;
  local_50 = (condition_variable *)(this + 0x50);
  std::
  _Deque_base<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::allocator<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::allocator<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>_>
                       *)(this + 0xb0),0);
  local_40 = this + 0x110;
  *(undefined8 *)(this + 0x150) = 0;
  *(undefined8 *)(this + 0x158) = 0;
  *(undefined8 *)(this + 0x140) = 0;
  *(undefined8 *)(this + 0x148) = 0;
  *(undefined8 *)(this + 0x130) = 0;
  *(undefined8 *)(this + 0x138) = 0;
  *(undefined8 *)(this + 0x120) = 0;
  *(undefined8 *)(this + 0x128) = 0;
  *(undefined8 *)(this + 0x110) = 0;
  *(undefined8 *)(this + 0x118) = 0;
  *(undefined8 *)(this + 0x100) = 0;
  *(undefined8 *)(this + 0x108) = 0;
  local_48 = this + 0xb0;
  std::
  _Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
  ::_M_initialize_map((_Deque_base<std::function<void_(unsigned_long,_unsigned_long)>,_std::allocator<std::function<void_(unsigned_long,_unsigned_long)>_>_>
                       *)local_40,0);
  if ((numWorkers < 1) && (numWorkers = std::thread::hardware_concurrency(), numWorkers == 0)) {
    return;
  }
  do {
    args_local_1 = (Database<DNA> *)this;
    std::thread::
    thread<WorkerQueue<QueryDatabaseSearcherWorker<DNA>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,WorkerQueue<SearchResultsWriterWorker<DNA>,std::deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>,std::__cxx11::string_const&>*,Database<DNA>const*,SearchParams<DNA>const&>::WorkerQueue(int,WorkerQueue<SearchResultsWriterWorker<DNA>,std::deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>,std::__cxx11::string_const&>*,Database<DNA>const*,SearchParams<DNA>const&)::_lambda(WorkerQueue<SearchResultsWriterWorker<DNA>,std::deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>,std::__cxx11::string_const&>*&&,Database<DNA>const*&&,SearchParams<DNA>const&)_1_,WorkerQueue<SearchResultsWriterWorker<DNA>,std::deque<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>,std::allocator<std::pair<Sequence<DNA>,std::deque<Hit<DNA>,std::allocator<Hit<DNA>>>>>>,std::__cxx11::string_const&>*&,Database<DNA>const*&,SearchParams<DNA>const&,void>
              (&local_38,(anon_class_8_1_8991fb9c_for__M_head_impl *)&args_local_1,&local_70,
               (Database<DNA> **)&args_local,local_58);
    piVar1 = *(id **)(this + 0x30);
    if (piVar1 == (id *)(*(long *)(this + 0x40) + -8)) {
      std::deque<std::thread,_std::allocator<std::thread>_>::_M_push_back_aux<std::thread>
                ((deque<std::thread,_std::allocator<std::thread>_> *)this,&local_38);
      if (local_38._M_id._M_thread != 0) {
        std::terminate();
      }
    }
    else {
      piVar1->_M_thread = 0;
      piVar1->_M_thread = (native_handle_type)local_38._M_id._M_thread;
      *(id **)(this + 0x30) = piVar1 + 1;
    }
    numWorkers = numWorkers + -1;
  } while (numWorkers != 0);
  return;
}

Assistant:

WorkerQueue( const int numWorkers = 1, Args... args )
      : mStop( false ), mWorkingCount( 0 ), mTotalEnqueued( 0 ),
        mTotalProcessed( 0 ) {
    auto actualWorkers =
      numWorkers <= 0 ? std::thread::hardware_concurrency() : numWorkers;

    for( int i = 0; i < actualWorkers; i++ ) {
      mWorkers.push_back( std::thread(
        [this]( Args&&... args ) {
          this->WorkerLoop( std::forward< Args >( args )... );
        },
        args... ) );
    }
  }